

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(SubjectSetRegister *this)

{
  shared_ptr<bidfx_public_api::price::pixie::EditionData> local_28;
  key_type local_14;
  SubjectSetRegister *local_10;
  SubjectSetRegister *this_local;
  
  local_10 = this;
  std::mutex::mutex(&this->mutex_);
  this->modified_ = false;
  std::
  map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::map(&this->subject_state_);
  std::
  map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::map(&this->subject_set_cache_);
  local_14 = 0;
  std::make_shared<bidfx_public_api::price::pixie::EditionData>();
  std::
  map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
  ::insert_or_assign<std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>
            ((map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
              *)&this->subject_set_cache_,&local_14,&local_28);
  std::shared_ptr<bidfx_public_api::price::pixie::EditionData>::~shared_ptr(&local_28);
  return;
}

Assistant:

SubjectSetRegister::SubjectSetRegister()
{
    subject_set_cache_.insert_or_assign(0, std::make_shared<EditionData>());
}